

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O2

Vec3fa __thiscall embree::XML::parm_Vec3fa(XML *this,string *parmID)

{
  RefCount RVar1;
  const_iterator cVar2;
  runtime_error *this_00;
  key_type *in_RDX;
  Vec3fa VVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&parmID[2].field_2,in_RDX);
  if (cVar2._M_node != (_Base_ptr)((long)&parmID[2].field_2 + 8)) {
    std::__cxx11::string::string((string *)&local_a0,(string *)(cVar2._M_node + 2));
    string_to_Vec3f((embree *)&local_c0,&local_a0);
    RVar1._vptr_RefCount._4_4_ = local_c0._M_dataplus._M_p._4_4_;
    RVar1._vptr_RefCount._0_4_ = local_c0._M_dataplus._M_p._0_4_;
    RVar1.refCounter.super___atomic_base<unsigned_long>._M_i._0_4_ =
         (undefined4)local_c0._M_string_length;
    RVar1.refCounter.super___atomic_base<unsigned_long>._M_i._4_4_ = 0;
    this->super_RefCount = RVar1;
    VVar3.field_0._0_8_ = std::__cxx11::string::~string((string *)&local_a0);
    VVar3.field_0.m128[3] = (float)local_c0._M_dataplus._M_p._4_4_;
    VVar3.field_0.m128[2] = (float)local_c0._M_dataplus._M_p._0_4_;
    return (Vec3fa)VVar3.field_0;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_80,(ParseLocation *)&parmID->field_2);
  std::operator+(&local_60,&local_80,": XML node has no parameter \"");
  std::operator+(&local_40,&local_60,in_RDX);
  std::operator+(&local_c0,&local_40,"\"");
  std::runtime_error::runtime_error(this_00,(string *)&local_c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec3fa parm_Vec3fa(const std::string& parmID) const {
      std::map<std::string,std::string>::const_iterator i = parms.find(parmID);
      if (i == parms.end()) THROW_RUNTIME_ERROR (loc.str()+": XML node has no parameter \"" + parmID + "\"");
      return Vec3fa(string_to_Vec3f(i->second));
    }